

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

cmGeneratorTarget * __thiscall
cmComputeLinkDepends::FindTargetToLink(cmComputeLinkDepends *this,int depender_index,string *name)

{
  reference pvVar1;
  cmGeneratorTarget *pcVar2;
  cmGeneratorTarget *depender;
  cmGeneratorTarget *from;
  string *name_local;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  depender = this->Target;
  if (-1 < depender_index) {
    pvVar1 = std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::operator[](&this->EntryList,(long)depender_index);
    if (pvVar1->Target != (cmGeneratorTarget *)0x0) {
      depender = pvVar1->Target;
    }
  }
  pcVar2 = cmGeneratorTarget::FindTargetToLink(depender,name);
  return pcVar2;
}

Assistant:

cmGeneratorTarget const* cmComputeLinkDepends::FindTargetToLink(
  int depender_index, const std::string& name)
{
  // Look for a target in the scope of the depender.
  cmGeneratorTarget const* from = this->Target;
  if (depender_index >= 0) {
    if (cmGeneratorTarget const* depender =
          this->EntryList[depender_index].Target) {
      from = depender;
    }
  }
  return from->FindTargetToLink(name);
}